

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnTableSizeExpr
          (BinaryReaderInterp *this,Index table_index)

{
  bool bVar1;
  Location local_88;
  Var local_68;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index table_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = table_index;
  pBStack_18 = this;
  Location::Location(&local_88);
  Var::Var(&local_68,table_index,&local_88);
  local_20 = (Enum)SharedValidator::OnTableSize
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_68);
  bVar1 = Failed((Result)local_20);
  Var::~Var(&local_68);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,TableSize,local_1c);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnTableSizeExpr(Index table_index) {
  CHECK_RESULT(validator_.OnTableSize(loc, Var(table_index)));
  istream_.Emit(Opcode::TableSize, table_index);
  return Result::Ok;
}